

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  uchar uVar1;
  undefined1 uVar2;
  uint uVar3;
  bool bVar4;
  size_t sStack_58;
  uint index_1;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  uchar *puStack_38;
  uint highest;
  size_t i;
  LodePNGColorMode *pLStack_28;
  uint num_channels;
  LodePNGColorMode *mode_local;
  uchar *in_local;
  size_t numpixels_local;
  uchar *buffer_local;
  
  i._4_4_ = 4;
  pLStack_28 = mode;
  mode_local = (LodePNGColorMode *)in;
  in_local = (uchar *)numpixels;
  numpixels_local = (size_t)buffer;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        *(undefined1 *)(numpixels_local + 3) = 0xff;
        numpixels_local = numpixels_local + 4;
      }
      if (mode->key_defined != 0) {
        numpixels_local = numpixels_local + numpixels * -4;
        for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
            puStack_38 = (uchar *)((long)puStack_38 + 1)) {
          if ((uint)*(byte *)numpixels_local == mode->key_r) {
            *(undefined1 *)(numpixels_local + 3) = 0;
          }
          numpixels_local = numpixels_local + 4;
        }
      }
    }
    else if (mode->bitdepth == 0x10) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        bVar4 = false;
        if (mode->key_defined != 0) {
          bVar4 = (uint)in[(long)puStack_38 * 2] * 0x100 + (uint)in[(long)puStack_38 * 2 + 1] ==
                  mode->key_r;
        }
        uVar2 = 0xff;
        if (bVar4) {
          uVar2 = 0;
        }
        *(undefined1 *)(numpixels_local + 3) = uVar2;
        numpixels_local = numpixels_local + 4;
      }
    }
    else {
      j._4_4_ = (1 << ((byte)mode->bitdepth & 0x1f)) - 1;
      _index = 0;
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        j_1._4_4_ = readBitsFromReversedStream
                              ((size_t *)&index,(uchar *)mode_local,(ulong)pLStack_28->bitdepth);
        uVar2 = (undefined1)((j_1._4_4_ * 0xff) / j._4_4_);
        *(undefined1 *)(numpixels_local + 2) = uVar2;
        *(undefined1 *)(numpixels_local + 1) = uVar2;
        *(undefined1 *)numpixels_local = uVar2;
        bVar4 = false;
        if (pLStack_28->key_defined != 0) {
          bVar4 = j_1._4_4_ == pLStack_28->key_r;
        }
        uVar2 = 0xff;
        if (bVar4) {
          uVar2 = 0;
        }
        *(undefined1 *)(numpixels_local + 3) = uVar2;
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        lodepng_memcpy((void *)numpixels_local,
                       (void *)((long)&mode_local->colortype + (long)puStack_38 * 3),3);
        *(undefined1 *)(numpixels_local + 3) = 0xff;
        numpixels_local = numpixels_local + i._4_4_;
      }
      if (pLStack_28->key_defined != 0) {
        numpixels_local = numpixels_local - (long)in_local * (ulong)i._4_4_;
        for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
          if ((((uint)*(byte *)numpixels_local == pLStack_28->key_r) &&
              ((uint)*(byte *)(numpixels_local + 1) == pLStack_28->key_g)) &&
             ((uint)*(byte *)(numpixels_local + 2) == pLStack_28->key_b)) {
            *(undefined1 *)(numpixels_local + 3) = 0;
          }
          numpixels_local = numpixels_local + i._4_4_;
        }
      }
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        *(uchar *)numpixels_local = in[(long)puStack_38 * 6];
        *(uchar *)(numpixels_local + 1) = in[(long)puStack_38 * 6 + 2];
        *(uchar *)(numpixels_local + 2) = in[(long)puStack_38 * 6 + 4];
        bVar4 = false;
        if (((mode->key_defined != 0) &&
            (bVar4 = false,
            (uint)in[(long)puStack_38 * 6] * 0x100 + (uint)in[(long)puStack_38 * 6 + 1] ==
            mode->key_r)) &&
           (bVar4 = false,
           (uint)in[(long)puStack_38 * 6 + 2] * 0x100 + (uint)in[(long)puStack_38 * 6 + 3] ==
           mode->key_g)) {
          bVar4 = (uint)in[(long)puStack_38 * 6 + 4] * 0x100 + (uint)in[(long)puStack_38 * 6 + 5] ==
                  mode->key_b;
        }
        uVar2 = 0xff;
        if (bVar4) {
          uVar2 = 0;
        }
        *(undefined1 *)(numpixels_local + 3) = uVar2;
        numpixels_local = numpixels_local + 4;
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        j_1._0_4_ = (uint)puStack_38[(long)&mode_local->colortype];
        lodepng_memcpy((void *)numpixels_local,
                       pLStack_28->palette + (ulong)puStack_38[(long)&mode_local->colortype] * 4,4);
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else {
      sStack_58 = 0;
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        uVar3 = readBitsFromReversedStream
                          (&stack0xffffffffffffffa8,(uchar *)mode_local,(ulong)pLStack_28->bitdepth)
        ;
        lodepng_memcpy((void *)numpixels_local,pLStack_28->palette + (uVar3 << 2),4);
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        *(uchar *)(numpixels_local + 3) = in[(long)puStack_38 * 2 + 1];
        numpixels_local = numpixels_local + 4;
      }
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 4];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        *(uchar *)(numpixels_local + 3) = in[(long)puStack_38 * 4 + 2];
        numpixels_local = numpixels_local + 4;
      }
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      lodepng_memcpy(buffer,in,numpixels << 2);
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        *(uchar *)numpixels_local = in[(long)puStack_38 * 8];
        *(uchar *)(numpixels_local + 1) = in[(long)puStack_38 * 8 + 2];
        *(uchar *)(numpixels_local + 2) = in[(long)puStack_38 * 8 + 4];
        *(uchar *)(numpixels_local + 3) = in[(long)puStack_38 * 8 + 6];
        numpixels_local = numpixels_local + 4;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
                                const unsigned char* LODEPNG_RESTRICT in,
                                const LodePNGColorMode* mode) {
  unsigned num_channels = 4;
  size_t i;
  if(mode->colortype == LCT_GREY) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        buffer[3] = 255;
      }
      if(mode->key_defined) {
        buffer -= numpixels * num_channels;
        for(i = 0; i != numpixels; ++i, buffer += num_channels) {
          if(buffer[0] == mode->key_r) buffer[3] = 0;
        }
      }
    } else if(mode->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    } else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 3], 3);
        buffer[3] = 255;
      }
      if(mode->key_defined) {
        buffer -= numpixels * num_channels;
        for(i = 0; i != numpixels; ++i, buffer += num_channels) {
          if(buffer[0] == mode->key_r && buffer[1]== mode->key_g && buffer[2] == mode->key_b) buffer[3] = 0;
        }
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  } else if(mode->colortype == LCT_PALETTE) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    } else {
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    }
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        buffer[3] = in[i * 2 + 1];
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        buffer[3] = in[i * 4 + 2];
      }
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 4);
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        buffer[3] = in[i * 8 + 6];
      }
    }
  }
}